

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Events.c
# Opt level: O3

void set_hero_route_force(tgestate_t *state,route_t *route)

{
  uint8_t *puVar1;
  
  puVar1 = &state->vischars[0].flags;
  *puVar1 = *puVar1 & 0xbf;
  state->vischars[0].route = *route;
  set_route(state,state->vischars);
  return;
}

Assistant:

void set_hero_route_force(tgestate_t *state, const route_t *route)
{
  vischar_t *vischar; /* was HL */

  assert(state != NULL);
  ASSERT_ROUTE_VALID(*route);

  vischar = &state->vischars[0];

  vischar->flags &= ~vischar_FLAGS_TARGET_IS_DOOR;
  vischar->route = *route;
  set_route(state, vischar);
}